

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

bool __thiscall DReachabilityPropagator::propagate(DReachabilityPropagator *this)

{
  _Rb_tree_header *p_Var1;
  Tint *pTVar2;
  int iVar3;
  _Base_ptr p_Var4;
  int *pt;
  TrailElem local_40;
  
  iVar3 = (this->in_nodes_tsize).v;
  if (iVar3 < this->in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize(&this->in_nodes_list,(long)iVar3);
    this->in_nodes_size = (this->in_nodes_tsize).v;
  }
  p_Var4 = (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->new_edge)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                        (this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = this->last_state_e + (int)p_Var4[1]._M_color;
      local_40.x = pTVar2->v;
      local_40.sz = 4;
      local_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar2->v = 0;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->rem_node)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                        (this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = this->last_state_n + (int)p_Var4[1]._M_color;
      local_40.x = pTVar2->v;
      local_40.sz = 4;
      local_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar2->v = 1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->new_node)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])
                        (this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = this->last_state_n + (int)p_Var4[1]._M_color;
      local_40.x = pTVar2->v;
      local_40.sz = 4;
      local_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar2->v = 0;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->rem_edge)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      iVar3 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x12])
                        (this,(ulong)p_Var4[1]._M_color);
      if ((char)iVar3 == '\0') {
        return false;
      }
      pTVar2 = this->last_state_e + (int)p_Var4[1]._M_color;
      local_40.x = pTVar2->v;
      local_40.sz = 4;
      local_40.pt = &pTVar2->v;
      vec<TrailElem>::push(&engine.trail,&local_40);
      pTVar2->v = 1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  if (((this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
       (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (iVar3 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x10])(this,1),
     (char)iVar3 == '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool DReachabilityPropagator::propagate() {
	update_innodes();  // In case I have not awaken
										 // through DReachabilityPropagator::wakeup method
	if (DEBUG) {
		std::cout << "PROPAGATE" << '\n';
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!propagateNewEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_IN;
	}

	for (it = rem_node.begin(); it != rem_node.end(); ++it) {
		if (!propagateRemNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_OUT;
	}

	// In this class, nothing happens here, but this way inheriting classes
	// can be executed here
	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!propagateNewNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_IN;
	}

	for (it = rem_edge.begin(); it != rem_edge.end(); ++it) {
		if (!propagateRemEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_OUT;
	}

	if (!new_node.empty() || !rem_edge.empty()) {
		if (DEBUG) {
			std::cout << "Checking new nodes and removed edges" << '\n';
		}
		if (!_propagateReachability()) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
	}

	if (DEBUG) {
		std::cout << "True" << __FILE__ << __LINE__ << '\n';
	}

	return true;
}